

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::GenerateImportTargetsConfig
          (cmExportBuildFileGenerator *this,ostream *os,string *config,string *suffix)

{
  bool bVar1;
  TargetType TVar2;
  reference ppcVar3;
  undefined1 local_78 [8];
  ImportPropertyMap properties;
  cmGeneratorTarget *target;
  iterator __end1;
  iterator __begin1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range1;
  string *suffix_local;
  string *config_local;
  ostream *os_local;
  cmExportBuildFileGenerator *this_local;
  
  __end1 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                     (&this->Exports);
  target = (cmGeneratorTarget *)
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                     (&this->Exports);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                *)&target);
    if (!bVar1) break;
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&__end1);
    properties._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppcVar3;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_78);
    TVar2 = GetExportTargetType(this,(cmGeneratorTarget *)
                                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (TVar2 != INTERFACE_LIBRARY) {
      SetImportLocationProperty
                (this,config,suffix,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (ImportPropertyMap *)local_78);
    }
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_78);
    if (!bVar1) {
      TVar2 = GetExportTargetType(this,(cmGeneratorTarget *)
                                       properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (TVar2 != INTERFACE_LIBRARY) {
        cmExportFileGenerator::SetImportDetailProperties
                  (&this->super_cmExportFileGenerator,config,suffix,
                   (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (ImportPropertyMap *)local_78);
        cmExportFileGenerator::SetImportLinkInterface
                  (&this->super_cmExportFileGenerator,config,suffix,BuildInterface,
                   (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (ImportPropertyMap *)local_78);
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                (this,os,config,properties._M_t._M_impl.super__Rb_tree_header._M_node_count,local_78
                );
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_78);
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix)
{
  for (cmGeneratorTarget* target : this->Exports) {
    // Collect import properties for this target.
    ImportPropertyMap properties;

    if (this->GetExportTargetType(target) != cmStateEnums::INTERFACE_LIBRARY) {
      this->SetImportLocationProperty(config, suffix, target, properties);
    }
    if (!properties.empty()) {
      // Get the rest of the target details.
      if (this->GetExportTargetType(target) !=
          cmStateEnums::INTERFACE_LIBRARY) {
        this->SetImportDetailProperties(config, suffix, target, properties);
        this->SetImportLinkInterface(config, suffix,
                                     cmGeneratorExpression::BuildInterface,
                                     target, properties);
      }

      // TODO: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      this->GenerateImportPropertyCode(os, config, target, properties);
    }
  }
}